

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

QHostInfo __thiscall QHostInfoAgent::reverseLookup(QHostInfoAgent *this,QHostAddress *address)

{
  socklen_t __salen;
  NetworkLayerProtocol NVar1;
  quint32 qVar2;
  int iVar3;
  storage_type *psVar4;
  sockaddr *__sa;
  long in_FS_OFFSET;
  Q_IPV6ADDR QVar5;
  QByteArrayView QVar6;
  QArrayDataPointer<QHostAddress> local_498;
  char hbuf [1025];
  undefined1 *local_68;
  char acStack_60 [8];
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo((QHostInfo *)this,-1);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  acStack_60[0] = -0x56;
  acStack_60[1] = -0x56;
  acStack_60[2] = -0x56;
  acStack_60[3] = -0x56;
  acStack_60[4] = -0x56;
  acStack_60[5] = -0x56;
  acStack_60[6] = -0x56;
  acStack_60[7] = -0x56;
  NVar1 = QHostAddress::protocol(address);
  if (NVar1 == IPv4Protocol) {
    __sa = (sockaddr *)&local_48;
    puStack_40 = (undefined1 *)0x0;
    local_48._0_2_ = 2;
    local_48._2_1_ = '\0';
    local_48._3_1_ = '\0';
    local_48._4_1_ = '\0';
    local_48._5_1_ = '\0';
    local_48._6_1_ = '\0';
    local_48._7_1_ = '\0';
    qVar2 = QHostAddress::toIPv4Address(address,(bool *)0x0);
    local_48 = (undefined1 *)
               CONCAT44(qVar2 >> 0x18 | (qVar2 & 0xff0000) >> 8 | (qVar2 & 0xff00) << 8 |
                        qVar2 << 0x18,(undefined4)local_48);
    __salen = 0x10;
  }
  else {
    __sa = (sockaddr *)&local_68;
    acStack_60[0] = '\0';
    acStack_60[1] = '\0';
    acStack_60[2] = '\0';
    acStack_60[3] = '\0';
    acStack_60[4] = '\0';
    acStack_60[5] = '\0';
    acStack_60[6] = '\0';
    acStack_60[7] = '\0';
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    local_68 = (undefined1 *)0xa;
    QVar5 = QHostAddress::toIPv6Address(address);
    acStack_60._0_4_ = QVar5.c._0_4_;
    acStack_60._4_4_ = QVar5.c._4_4_;
    uStack_58 = QVar5.c._8_4_;
    uStack_54 = QVar5.c._12_4_;
    __salen = 0x1c;
  }
  memset(hbuf,0xaa,0x401);
  iVar3 = getnameinfo(__sa,__salen,hbuf,0x401,(char *)0x0,0,0);
  if (iVar3 == 0) {
    psVar4 = (storage_type *)QByteArrayView::lengthHelperCharArray(hbuf,0x401);
    QVar6.m_data = psVar4;
    QVar6.m_size = (qsizetype)&local_498;
    QString::fromLatin1(QVar6);
    QHostInfo::setHostName((QHostInfo *)this,(QString *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
  }
  QHostInfo::hostName((QString *)&local_498,(QHostInfo *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
  if (local_498.size == 0) {
    QHostAddress::toString((QString *)&local_498,address);
    QHostInfo::setHostName((QHostInfo *)this,(QString *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
  }
  local_498.d = (Data *)0x0;
  local_498.ptr = (QHostAddress *)0x0;
  local_498.size = 0;
  QList<QHostAddress>::emplaceBack<QHostAddress_const&>((QList<QHostAddress> *)&local_498,address);
  QHostInfo::setAddresses((QHostInfo *)this,(QList<QHostAddress> *)&local_498);
  QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_498);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::reverseLookup(const QHostAddress &address)
{
    QHostInfo results;
    // Reverse lookup
    sockaddr_in sa4;
    sockaddr_in6 sa6;
    sockaddr *sa = nullptr;
    QT_SOCKLEN_T saSize;
    if (address.protocol() == QAbstractSocket::IPv4Protocol) {
        sa = reinterpret_cast<sockaddr *>(&sa4);
        saSize = sizeof(sa4);
        memset(&sa4, 0, sizeof(sa4));
        sa4.sin_family = AF_INET;
        sa4.sin_addr.s_addr = htonl(address.toIPv4Address());
    } else {
        sa = reinterpret_cast<sockaddr *>(&sa6);
        saSize = sizeof(sa6);
        memset(&sa6, 0, sizeof(sa6));
        sa6.sin6_family = AF_INET6;
        memcpy(&sa6.sin6_addr, address.toIPv6Address().c, sizeof(sa6.sin6_addr));
    }

    char hbuf[NI_MAXHOST];
    if (sa && getnameinfo(sa, saSize, hbuf, sizeof(hbuf), nullptr, 0, 0) == 0)
        results.setHostName(QString::fromLatin1(hbuf));

    if (results.hostName().isEmpty())
        results.setHostName(address.toString());
    results.setAddresses(QList<QHostAddress>() << address);

    return results;
}